

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<TPZFlopCounter>::SolveEigenvaluesJacobi
          (TPZMatrix<TPZFlopCounter> *this,int64_t *numiterations,REAL *tol,
          TPZVec<TPZFlopCounter> *Sort)

{
  bool bVar1;
  reference val;
  TPZFlopCounter *pTVar2;
  TPZVec<TPZFlopCounter> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double dVar3;
  double dVar4;
  double __x_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar5;
  iterator e;
  iterator w;
  TPZFlopCounter exps;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  TPZFlopCounter Spq;
  TPZFlopCounter Sqq;
  TPZFlopCounter Spp;
  TPZFlopCounter aux2;
  TPZFlopCounter aux;
  TPZFlopCounter sint;
  TPZFlopCounter cost;
  TPZFlopCounter theta;
  TPZFlopCounter maxval;
  int64_t q;
  int64_t p;
  int64_t j;
  int64_t i;
  int64_t size;
  TPZFlopCounter res;
  int64_t iter;
  multiset<double,_std::less<double>,_std::allocator<double>_> *in_stack_fffffffffffffcb8;
  iterator in_stack_fffffffffffffcc0;
  multiset<double,_std::less<double>,_std::allocator<double>_> *in_stack_fffffffffffffcc8;
  TPZFlopCounter *in_stack_fffffffffffffcd0;
  TPZFlopCounter *in_stack_fffffffffffffcd8;
  TPZMatrix<TPZFlopCounter> *in_stack_fffffffffffffce0;
  TPZFlopCounter local_2f8;
  _Base_ptr local_2f0;
  _Self local_2e8;
  _Rb_tree_const_iterator<double> local_2e0;
  _Base_ptr local_2d8;
  REAL local_2d0;
  multiset<double,_std::less<double>,_std::allocator<double>_> *local_2c8;
  REAL local_2b0;
  REAL local_278;
  REAL local_270;
  REAL local_268;
  REAL local_260;
  REAL local_258;
  REAL local_250;
  REAL local_248;
  REAL local_240;
  REAL local_238;
  REAL local_230;
  double local_228;
  TPZFlopCounter local_220;
  REAL local_218;
  REAL local_210;
  REAL local_208;
  REAL local_200;
  REAL local_1f8;
  REAL local_1f0;
  REAL local_1e8;
  REAL local_1e0;
  REAL local_1d8;
  double local_1d0;
  TPZFlopCounter local_1c8;
  REAL local_1c0;
  REAL local_1b8;
  REAL local_1b0;
  REAL local_1a8;
  REAL local_1a0;
  REAL local_198;
  REAL local_190;
  double local_188;
  REAL local_180;
  double local_178;
  REAL local_170;
  REAL local_168;
  double local_160;
  REAL local_158;
  double local_150;
  REAL local_148;
  REAL local_140;
  double local_138;
  double local_130;
  REAL local_128;
  double local_120;
  TPZFlopCounter local_118;
  REAL local_110;
  REAL local_108;
  double local_100;
  double local_f8;
  TPZFlopCounter local_f0;
  REAL local_e8;
  double local_e0;
  TPZFlopCounter local_d8;
  double local_d0;
  TPZFlopCounter local_c8;
  TPZFlopCounter local_c0;
  TPZFlopCounter local_b8;
  TPZFlopCounter local_b0;
  TPZFlopCounter local_a8;
  TPZFlopCounter local_a0;
  TPZFlopCounter local_98;
  TPZFlopCounter local_90;
  TPZFlopCounter local_88;
  TPZFlopCounter local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  int64_t local_58;
  TPZFlopCounter local_50;
  double local_48;
  TPZFlopCounter local_40;
  REAL local_38;
  long local_30;
  TPZVec<TPZFlopCounter> *local_28;
  double *local_20;
  long *local_18;
  bool local_1;
  
  local_30 = 0;
  local_48 = 2.0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  TPZFlopCounter::TPZFlopCounter(&local_40,&local_48);
  TPZFlopCounter::TPZFlopCounter(&local_50,local_20);
  local_38 = (REAL)TPZFlopCounter::operator*
                             ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                              (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
  local_58 = TPZBaseMatrix::Rows(in_RDI);
  local_70 = -1;
  local_78 = -1;
  TPZFlopCounter::TPZFlopCounter(&local_80);
  TPZFlopCounter::TPZFlopCounter(&local_88);
  TPZFlopCounter::TPZFlopCounter(&local_90);
  TPZFlopCounter::TPZFlopCounter(&local_98);
  TPZFlopCounter::TPZFlopCounter(&local_a0);
  TPZFlopCounter::TPZFlopCounter(&local_a8);
  TPZFlopCounter::TPZFlopCounter(&local_b0);
  TPZFlopCounter::TPZFlopCounter(&local_b8);
  TPZFlopCounter::TPZFlopCounter(&local_c0);
  dVar3 = extraout_XMM0_Qa;
  for (; local_30 < *local_18; local_30 = local_30 + 1) {
    local_d0 = 0.0;
    TPZFlopCounter::TPZFlopCounter(&local_c8,&local_d0);
    local_80.fVal = local_c8.fVal;
    dVar3 = extraout_XMM0_Qa_00;
    for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
      for (local_68 = 0; local_68 < local_60; local_68 = local_68 + 1) {
        operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                   (int64_t)in_stack_fffffffffffffcd0);
        dVar3 = fabs(__x);
        dVar4 = fabs(dVar3);
        if (dVar4 < dVar3) {
          local_70 = local_60;
          local_78 = local_68;
          operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                     (int64_t)in_stack_fffffffffffffcd0);
          local_e0 = fabs(__x_00);
          TPZFlopCounter::TPZFlopCounter(&local_d8,&local_e0);
          local_80.fVal = local_d8.fVal;
          dVar3 = extraout_XMM0_Qa_01;
        }
      }
    }
    local_38 = local_80.fVal;
    dVar4 = fabs(dVar3);
    dVar3 = *local_20;
    if (dVar4 < dVar3) break;
    local_f8 = 0.5;
    TPZFlopCounter::TPZFlopCounter(&local_f0,&local_f8);
    local_120 = 2.0;
    TPZFlopCounter::TPZFlopCounter(&local_118,&local_120);
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_110 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_128 = (REAL)TPZFlopCounter::operator-
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_108 = (REAL)TPZFlopCounter::operator/
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_100 = atan(local_108);
    local_e8 = (REAL)TPZFlopCounter::operator*
                               ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_88 = (TPZFlopCounter)local_e8;
    local_130 = cos(local_e8);
    local_90.fVal = local_130;
    local_138 = sin(local_130);
    local_98.fVal = local_138;
    for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
      if ((local_60 != local_70) && (local_60 != local_78)) {
        operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                   (int64_t)in_stack_fffffffffffffcd0);
        local_150 = local_90.fVal;
        local_148 = (REAL)TPZFlopCounter::operator*
                                    ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                     (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
        operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                   (int64_t)in_stack_fffffffffffffcd0);
        local_160 = local_98.fVal;
        local_158 = (REAL)TPZFlopCounter::operator*
                                    ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                     (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
        local_140 = (REAL)TPZFlopCounter::operator-
                                    ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                     (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
        local_a0 = (TPZFlopCounter)local_140;
        operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                   (int64_t)in_stack_fffffffffffffcd0);
        local_178 = local_98.fVal;
        local_170 = (REAL)TPZFlopCounter::operator*
                                    ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                     (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
        operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                   (int64_t)in_stack_fffffffffffffcd0);
        local_188 = local_90.fVal;
        local_180 = (REAL)TPZFlopCounter::operator*
                                    ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                     (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
        local_168 = (REAL)TPZFlopCounter::operator+
                                    ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                     (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
        local_a8 = (TPZFlopCounter)local_168;
        pTVar2 = operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                            (int64_t)in_stack_fffffffffffffcd0);
        pTVar2->fVal = local_a0.fVal;
        pTVar2 = operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                            (int64_t)in_stack_fffffffffffffcd0);
        pTVar2->fVal = local_a0.fVal;
        pTVar2 = operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                            (int64_t)in_stack_fffffffffffffcd0);
        pTVar2->fVal = local_a8.fVal;
        pTVar2 = operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                            (int64_t)in_stack_fffffffffffffcd0);
        pTVar2->fVal = local_a8.fVal;
      }
    }
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_1a8 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_1a0 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_1d0 = 2.0;
    TPZFlopCounter::TPZFlopCounter(&local_1c8,&local_1d0);
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_1c0 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_1b8 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_1b0 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_198 = (REAL)TPZFlopCounter::operator-
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_1e0 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_1d8 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_190 = (REAL)TPZFlopCounter::operator+
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_b0 = (TPZFlopCounter)local_190;
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_200 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_1f8 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_228 = 2.0;
    TPZFlopCounter::TPZFlopCounter(&local_220,&local_228);
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_218 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_210 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_208 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_1f0 = (REAL)TPZFlopCounter::operator+
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_238 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_230 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_1e8 = (REAL)TPZFlopCounter::operator+
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_b8 = (TPZFlopCounter)local_1e8;
    in_stack_fffffffffffffcd8 =
         operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                    (int64_t)in_stack_fffffffffffffcd0);
    operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
               (int64_t)in_stack_fffffffffffffcd0);
    local_258 = (REAL)TPZFlopCounter::operator-
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_250 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_248 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    in_stack_fffffffffffffce0 =
         (TPZMatrix<TPZFlopCounter> *)
         operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                    (int64_t)in_stack_fffffffffffffcd0);
    local_270 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_278 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_268 = (REAL)TPZFlopCounter::operator-
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_260 = (REAL)TPZFlopCounter::operator*
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_240 = (REAL)TPZFlopCounter::operator+
                                ((TPZFlopCounter *)in_stack_fffffffffffffcc8,
                                 (TPZFlopCounter *)in_stack_fffffffffffffcc0._M_node);
    local_c0 = (TPZFlopCounter)local_240;
    pTVar2 = operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                        (int64_t)in_stack_fffffffffffffcd0);
    pTVar2->fVal = local_b0.fVal;
    pTVar2 = operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                        (int64_t)in_stack_fffffffffffffcd0);
    pTVar2->fVal = local_b8.fVal;
    pTVar2 = operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                        (int64_t)in_stack_fffffffffffffcd0);
    pTVar2->fVal = local_c0.fVal;
    pTVar2 = operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                        (int64_t)in_stack_fffffffffffffcd0);
    pTVar2->fVal = local_c0.fVal;
    dVar3 = extraout_XMM0_Qa_02;
  }
  if (local_28 != (TPZVec<TPZFlopCounter> *)0x0) {
    std::multiset<double,_std::less<double>,_std::allocator<double>_>::multiset
              ((multiset<double,_std::less<double>,_std::allocator<double>_> *)0x130830a);
    for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
      in_stack_fffffffffffffcd0 =
           operator()(in_stack_fffffffffffffce0,(int64_t)in_stack_fffffffffffffcd8,
                      (int64_t)in_stack_fffffffffffffcd0);
      local_2d0 = in_stack_fffffffffffffcd0->fVal;
      local_2b0 = local_2d0;
      in_stack_fffffffffffffcc8 =
           (multiset<double,_std::less<double>,_std::allocator<double>_> *)
           TPZExtractVal::val<TPZFlopCounter>((TPZFlopCounter)0x1308370);
      local_2c8 = in_stack_fffffffffffffcc8;
      in_stack_fffffffffffffcc0 =
           std::multiset<double,_std::less<double>,_std::allocator<double>_>::insert
                     (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0._M_node);
      local_2d8 = in_stack_fffffffffffffcc0._M_node;
    }
    (*local_28->_vptr_TPZVec[3])(local_28,local_58);
    std::_Rb_tree_const_iterator<double>::_Rb_tree_const_iterator(&local_2e0);
    local_2e8._M_node =
         (_Base_ptr)
         std::multiset<double,_std::less<double>,_std::allocator<double>_>::end
                   (in_stack_fffffffffffffcb8);
    local_60 = local_58 + -1;
    local_2f0 = (_Base_ptr)
                std::multiset<double,_std::less<double>,_std::allocator<double>_>::begin
                          (in_stack_fffffffffffffcb8);
    local_2e0._M_node = local_2f0;
    while (bVar1 = std::operator!=(&local_2e0,&local_2e8), bVar1) {
      val = std::_Rb_tree_const_iterator<double>::operator*
                      ((_Rb_tree_const_iterator<double> *)0x1308472);
      TPZFlopCounter::TPZFlopCounter(&local_2f8,val);
      pTVar2 = TPZVec<TPZFlopCounter>::operator[](local_28,local_60);
      pTVar2->fVal = local_2f8.fVal;
      std::_Rb_tree_const_iterator<double>::operator++
                ((_Rb_tree_const_iterator<double> *)in_stack_fffffffffffffcc8,
                 (int)((ulong)in_stack_fffffffffffffcc0._M_node >> 0x20));
      local_60 = local_60 + -1;
    }
    std::multiset<double,_std::less<double>,_std::allocator<double>_>::~multiset
              ((multiset<double,_std::less<double>,_std::allocator<double>_> *)0x13084dc);
    dVar3 = extraout_XMM0_Qa_03;
  }
  dVar4 = fabs(dVar3);
  dVar3 = *local_20;
  if (dVar3 <= dVar4) {
    dVar5 = fabs(dVar3);
    *local_20 = dVar5;
    *local_18 = local_30;
  }
  else {
    dVar5 = fabs(dVar3);
    *local_20 = dVar5;
    *local_18 = local_30;
  }
  local_1 = dVar3 > dVar4;
  return local_1;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}